

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_staging.cc
# Opt level: O1

int __thiscall NarpcStaging::SendBytes(NarpcStaging *this,int socket,uchar *buf,int size)

{
  ulong uVar1;
  int iVar2;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"sending buf of size ",0x14);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,size);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  uVar4 = send(socket,buf,(long)size,0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"res ",4);
  iVar7 = (int)uVar4;
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  if (-1 < iVar7) {
    uVar6 = size - iVar7;
    do {
      if ((int)uVar6 < 1) {
        return uVar6;
      }
      uVar5 = send(socket,buf + (int)(size - uVar6),(ulong)uVar6,0);
      iVar2 = (int)uVar5;
      iVar7 = 0;
      if (-1 < iVar2) {
        iVar7 = iVar2;
      }
      uVar6 = uVar6 - iVar7;
      uVar1 = uVar4;
      if (-1 >= iVar2) {
        uVar1 = uVar5;
      }
      uVar4 = uVar1 & 0xffffffff;
      iVar7 = (int)uVar1;
    } while (-1 < iVar2);
  }
  return iVar7;
}

Assistant:

int NarpcStaging::SendBytes(int socket, unsigned char *buf, int size) {
  cout << "sending buf of size " << size << endl;
  int res = send(socket, buf, (size_t)size, (int)0);
  cout << "res " << res << endl;
  if (res < 0) {
    return res;
  }
  int remaining = size - res;
  while (remaining > 0) {
    int offset = size - remaining;
    res = send(socket, buf + offset, (size_t)remaining, (int)0);
    if (res < 0) {
      return res;
    }
    remaining -= res;
  }
  return remaining;
}